

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int aead_setup_crypto(ptls_aead_context_t *_ctx,int is_enc,void *key,EVP_CIPHER *cipher)

{
  int iVar1;
  EVP_CIPHER_CTX *pEVar2;
  int local_3c;
  int ret;
  aead_crypto_context_t *ctx;
  EVP_CIPHER *cipher_local;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *_ctx_local;
  
  _ctx->dispose_crypto = aead_dispose_crypto;
  if (is_enc == 0) {
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    _ctx->do_decrypt = aead_do_decrypt;
  }
  else {
    _ctx->do_encrypt_init = aead_do_encrypt_init;
    _ctx->do_encrypt_update = aead_do_encrypt_update;
    _ctx->do_encrypt_final = aead_do_encrypt_final;
    _ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_void_ptr_void_ptr_size_t
          *)0x0;
  }
  _ctx[1].algo = (st_ptls_aead_algorithm_t *)0x0;
  pEVar2 = EVP_CIPHER_CTX_new();
  _ctx[1].algo = (st_ptls_aead_algorithm_t *)pEVar2;
  if (pEVar2 == (EVP_CIPHER_CTX *)0x0) {
    local_3c = 0x201;
  }
  else {
    if (is_enc == 0) {
      iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)cipher,(ENGINE *)0x0,
                                 (uchar *)key,(uchar *)0x0);
      if (iVar1 == 0) {
        local_3c = 0x203;
        goto LAB_00110e07;
      }
    }
    else {
      iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)cipher,(ENGINE *)0x0,
                                 (uchar *)key,(uchar *)0x0);
      if (iVar1 == 0) {
        local_3c = 0x203;
        goto LAB_00110e07;
      }
    }
    iVar1 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)_ctx[1].algo,9,(int)_ctx->algo->iv_size,
                                (void *)0x0);
    if (iVar1 != 0) {
      return 0;
    }
    local_3c = 0x203;
  }
LAB_00110e07:
  aead_dispose_crypto(_ctx);
  return local_3c;
}

Assistant:

static int aead_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key, const EVP_CIPHER *cipher)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    int ret;

    ctx->super.dispose_crypto = aead_dispose_crypto;
    if (is_enc) {
        ctx->super.do_encrypt_init = aead_do_encrypt_init;
        ctx->super.do_encrypt_update = aead_do_encrypt_update;
        ctx->super.do_encrypt_final = aead_do_encrypt_final;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_decrypt = aead_do_decrypt;
    }
    ctx->evp_ctx = NULL;

    if ((ctx->evp_ctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    if (is_enc) {
        if (!EVP_EncryptInit_ex(ctx->evp_ctx, cipher, NULL, key, NULL)) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
    } else {
        if (!EVP_DecryptInit_ex(ctx->evp_ctx, cipher, NULL, key, NULL)) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
    }
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_IVLEN, (int)ctx->super.algo->iv_size, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Error;
    }

    return 0;

Error:
    aead_dispose_crypto(&ctx->super);
    return ret;
}